

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QNetworkCookie>::insert
          (QMovableArrayOps<QNetworkCookie> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QNetworkCookie **ppQVar1;
  qsizetype *pqVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QNetworkCookie copy;
  Inserter local_58;
  QNetworkCookie local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d.d.ptr = (QSharedDataPointer<QNetworkCookiePrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkCookie::QNetworkCookie(&local_30,t);
  bVar3 = (this->super_QGenericArrayOps<QNetworkCookie>).super_QArrayDataPointer<QNetworkCookie>.
          size != 0;
  QArrayDataPointer<QNetworkCookie>::detachAndGrow
            ((QArrayDataPointer<QNetworkCookie> *)this,(uint)(i == 0 && bVar3),n,
             (QNetworkCookie **)0x0,(QArrayDataPointer<QNetworkCookie> *)0x0);
  if (i == 0 && bVar3) {
    if (n != 0) {
      do {
        QNetworkCookie::QNetworkCookie
                  ((this->super_QGenericArrayOps<QNetworkCookie>).
                   super_QArrayDataPointer<QNetworkCookie>.ptr + -1,&local_30);
        ppQVar1 = &(this->super_QGenericArrayOps<QNetworkCookie>).
                   super_QArrayDataPointer<QNetworkCookie>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        pqVar2 = &(this->super_QGenericArrayOps<QNetworkCookie>).
                  super_QArrayDataPointer<QNetworkCookie>.size;
        *pqVar2 = *pqVar2 + 1;
        n = n + -1;
      } while (n != 0);
    }
  }
  else {
    local_58.displaceFrom =
         (this->super_QGenericArrayOps<QNetworkCookie>).super_QArrayDataPointer<QNetworkCookie>.ptr
         + i;
    local_58.displaceTo = local_58.displaceFrom + n;
    local_58.bytes =
         ((this->super_QGenericArrayOps<QNetworkCookie>).super_QArrayDataPointer<QNetworkCookie>.
          size - i) * 8;
    local_58.data = (QArrayDataPointer<QNetworkCookie> *)this;
    local_58.nInserts = n;
    memmove(local_58.displaceTo,local_58.displaceFrom,local_58.bytes);
    if (n != 0) {
      do {
        QNetworkCookie::QNetworkCookie(local_58.displaceFrom,&local_30);
        local_58.displaceFrom = local_58.displaceFrom + 1;
        n = n + -1;
      } while (n != 0);
    }
    Inserter::~Inserter(&local_58);
  }
  QNetworkCookie::~QNetworkCookie(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }